

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::banPlayer(Server *this,int id,string_view banner,string_view reason)

{
  _Alloc_hider _Var1;
  rep rVar2;
  _List_node_base *p_Var3;
  PlayerInfo *player;
  string_view str;
  string out_reason;
  string local_60;
  string local_40;
  
  str._M_str = banner._M_str;
  if (this->m_rconBan == true) {
    str._M_len = (size_t)reason._M_str;
    escapifyRCON_abi_cxx11_(&local_40,(RenX *)reason._M_len,str);
    string_printf_abi_cxx11_
              (&local_60,"ckickban pid%d %.*s\n",id,local_40._M_string_length,
               local_40._M_dataplus._M_p);
    _Var1._M_p = local_60._M_dataplus._M_p;
    rVar2 = std::chrono::_V2::steady_clock::now();
    (this->m_lastSendActivity).__d.__r = rVar2;
    Jupiter::Socket::send(&this->m_sock,local_60._M_string_length,_Var1._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    player = (PlayerInfo *)0x0;
    p_Var3 = (_List_node_base *)&this->players;
    do {
      p_Var3 = (((_List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)&p_Var3->_M_next
                )->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var3 == (_List_node_base *)&this->players) goto LAB_00134b48;
    } while (*(int *)((long)&p_Var3[0x10]._M_prev + 4) != id);
    player = (PlayerInfo *)(p_Var3 + 1);
LAB_00134b48:
    if (player != (PlayerInfo *)0x0) {
      banPlayer(this,player,banner,reason,(seconds)0x0);
    }
  }
  return;
}

Assistant:

void RenX::Server::banPlayer(int id, std::string_view banner, std::string_view reason) {
	if (m_rconBan) {
		std::string out_reason = RenX::escapifyRCON(reason);
		sendSocket(string_printf("ckickban pid%d %.*s\n", id, out_reason.size(), out_reason.data()));
	}
	else {
		RenX::PlayerInfo *player = getPlayer(id);
		if (player != nullptr) {
			banPlayer(*player, banner, reason);
		}
	}
}